

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.h
# Opt level: O1

bool __thiscall CInput::CJoystick::Absolute(CJoystick *this,float *pX,float *pY)

{
  CConfig *pCVar1;
  bool bVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar3;
  float fVar4;
  
  if ((this->m_pInput->m_MouseInputRelative == true) &&
     (pCVar1 = this->m_pInput->m_pConfig, pCVar1->m_JoystickEnable != 0)) {
    (*(this->super_IJoystick)._vptr_IJoystick[6])(this,(ulong)(uint)pCVar1->m_JoystickX);
    (*(this->super_IJoystick)._vptr_IJoystick[6])
              (this,(ulong)(uint)this->m_pInput->m_pConfig->m_JoystickY);
    fVar3 = (float)this->m_pInput->m_pConfig->m_JoystickTolerance / 50.0;
    fVar4 = extraout_XMM0_Da * extraout_XMM0_Da + extraout_XMM0_Da_00 * extraout_XMM0_Da_00;
    fVar3 = fVar3 * fVar3;
    bVar2 = fVar3 < fVar4;
    if (fVar3 < fVar4) {
      *pX = extraout_XMM0_Da;
      *pY = extraout_XMM0_Da_00;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

CInput *Input() { return m_pInput; }